

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O3

XrResult xrEnumerateSwapchainImages
                   (XrSwapchain swapchain,uint32_t imageCapacityInput,uint32_t *imageCountOutput,
                   XrSwapchainImageBaseHeader *images)

{
  XrResult XVar1;
  LoaderInstance *loader_instance;
  LoaderInstance *local_98 [15];
  
  XVar1 = ActiveLoaderInstance::Get(local_98,"xrEnumerateSwapchainImages");
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    XVar1 = (*((local_98[0]->_dispatch_table)._M_t.
               super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
               ._M_t.
               super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
               .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl)->
              EnumerateSwapchainImages)(swapchain,imageCapacityInput,imageCountOutput,images);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateSwapchainImages(
    XrSwapchain                                 swapchain,
    uint32_t                                    imageCapacityInput,
    uint32_t*                                   imageCountOutput,
    XrSwapchainImageBaseHeader*                 images) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateSwapchainImages");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateSwapchainImages(swapchain, imageCapacityInput, imageCountOutput, images);
    }
    return result;
}